

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O0

void __thiscall QPDF::dumpHPageOffset(QPDF *this)

{
  ulong uVar1;
  HPageOffsetEntry *pHVar2;
  pointer pMVar3;
  element_type *peVar4;
  element_type *peVar5;
  Pipeline *pPVar6;
  qpdf_offset_t i;
  HPageOffsetEntry *pHVar7;
  size_t sVar8;
  reference pvVar9;
  shared_ptr<Pipeline> local_80;
  shared_ptr<Pipeline> local_70;
  ulong local_60;
  size_t i2;
  reference local_48;
  HPageOffsetEntry *pe;
  size_t i1;
  shared_ptr<Pipeline> local_28;
  HPageOffset *local_18;
  HPageOffset *t;
  QPDF *this_local;
  
  t = (HPageOffset *)this;
  pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  local_18 = &pMVar3->page_offset_hints;
  pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  peVar4 = std::__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      pMVar3);
  QPDFLogger::getInfo((QPDFLogger *)&local_28,SUB81(peVar4,0));
  peVar5 = std::__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                     ((__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &local_28);
  pPVar6 = Pipeline::operator<<(peVar5,"min_nobjects: ");
  pPVar6 = Pipeline::operator<<(pPVar6,local_18->min_nobjects);
  pPVar6 = Pipeline::operator<<(pPVar6,"\n");
  pPVar6 = Pipeline::operator<<(pPVar6,"first_page_offset: ");
  i = adjusted_offset(this,local_18->first_page_offset);
  pPVar6 = Pipeline::operator<<(pPVar6,i);
  pPVar6 = Pipeline::operator<<(pPVar6,"\n");
  pPVar6 = Pipeline::operator<<(pPVar6,"nbits_delta_nobjects: ");
  pPVar6 = Pipeline::operator<<(pPVar6,local_18->nbits_delta_nobjects);
  pPVar6 = Pipeline::operator<<(pPVar6,"\n");
  pPVar6 = Pipeline::operator<<(pPVar6,"min_page_length: ");
  pPVar6 = Pipeline::operator<<(pPVar6,local_18->min_page_length);
  pPVar6 = Pipeline::operator<<(pPVar6,"\n");
  pPVar6 = Pipeline::operator<<(pPVar6,"nbits_delta_page_length: ");
  pPVar6 = Pipeline::operator<<(pPVar6,local_18->nbits_delta_page_length);
  pPVar6 = Pipeline::operator<<(pPVar6,"\n");
  pPVar6 = Pipeline::operator<<(pPVar6,"min_content_offset: ");
  pPVar6 = Pipeline::operator<<(pPVar6,local_18->min_content_offset);
  pPVar6 = Pipeline::operator<<(pPVar6,"\n");
  pPVar6 = Pipeline::operator<<(pPVar6,"nbits_delta_content_offset: ");
  pPVar6 = Pipeline::operator<<(pPVar6,local_18->nbits_delta_content_offset);
  pPVar6 = Pipeline::operator<<(pPVar6,"\n");
  pPVar6 = Pipeline::operator<<(pPVar6,"min_content_length: ");
  pPVar6 = Pipeline::operator<<(pPVar6,local_18->min_content_length);
  pPVar6 = Pipeline::operator<<(pPVar6,"\n");
  pPVar6 = Pipeline::operator<<(pPVar6,"nbits_delta_content_length: ");
  pPVar6 = Pipeline::operator<<(pPVar6,local_18->nbits_delta_content_length);
  pPVar6 = Pipeline::operator<<(pPVar6,"\n");
  pPVar6 = Pipeline::operator<<(pPVar6,"nbits_nshared_objects: ");
  pPVar6 = Pipeline::operator<<(pPVar6,local_18->nbits_nshared_objects);
  pPVar6 = Pipeline::operator<<(pPVar6,"\n");
  pPVar6 = Pipeline::operator<<(pPVar6,"nbits_shared_identifier: ");
  pPVar6 = Pipeline::operator<<(pPVar6,local_18->nbits_shared_identifier);
  pPVar6 = Pipeline::operator<<(pPVar6,"\n");
  pPVar6 = Pipeline::operator<<(pPVar6,"nbits_shared_numerator: ");
  pPVar6 = Pipeline::operator<<(pPVar6,local_18->nbits_shared_numerator);
  pPVar6 = Pipeline::operator<<(pPVar6,"\n");
  pPVar6 = Pipeline::operator<<(pPVar6,"shared_denominator: ");
  pPVar6 = Pipeline::operator<<(pPVar6,local_18->shared_denominator);
  Pipeline::operator<<(pPVar6,"\n");
  std::shared_ptr<Pipeline>::~shared_ptr(&local_28);
  pe = (HPageOffsetEntry *)0x0;
  while( true ) {
    pHVar2 = pe;
    pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    pHVar7 = (HPageOffsetEntry *)toS<int>(&(pMVar3->linp).npages);
    if (pHVar7 <= pHVar2) break;
    local_48 = std::vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>::at
                         (&local_18->entries,(size_type)pe);
    pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    peVar4 = std::__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )pMVar3);
    QPDFLogger::getInfo((QPDFLogger *)&i2,SUB81(peVar4,0));
    peVar5 = std::__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                       ((__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &i2);
    pPVar6 = Pipeline::operator<<(peVar5,"Page ");
    pPVar6 = Pipeline::operator<<(pPVar6,(unsigned_long)pe);
    pPVar6 = Pipeline::operator<<(pPVar6,":\n");
    pPVar6 = Pipeline::operator<<(pPVar6,"  nobjects: ");
    pPVar6 = Pipeline::operator<<(pPVar6,local_48->delta_nobjects + local_18->min_nobjects);
    pPVar6 = Pipeline::operator<<(pPVar6,"\n");
    pPVar6 = Pipeline::operator<<(pPVar6,"  length: ");
    pPVar6 = Pipeline::operator<<
                       (pPVar6,local_48->delta_page_length + (long)local_18->min_page_length);
    pPVar6 = Pipeline::operator<<(pPVar6,"\n");
    pPVar6 = Pipeline::operator<<(pPVar6,"  content_offset: ");
    pPVar6 = Pipeline::operator<<
                       (pPVar6,local_48->delta_content_offset + (long)local_18->min_content_offset);
    pPVar6 = Pipeline::operator<<(pPVar6,"\n");
    pPVar6 = Pipeline::operator<<(pPVar6,"  content_length: ");
    pPVar6 = Pipeline::operator<<
                       (pPVar6,local_48->delta_content_length + (long)local_18->min_content_length);
    pPVar6 = Pipeline::operator<<(pPVar6,"\n");
    pPVar6 = Pipeline::operator<<(pPVar6,"  nshared_objects: ");
    pPVar6 = Pipeline::operator<<(pPVar6,local_48->nshared_objects);
    Pipeline::operator<<(pPVar6,"\n");
    std::shared_ptr<Pipeline>::~shared_ptr((shared_ptr<Pipeline> *)&i2);
    local_60 = 0;
    while( true ) {
      uVar1 = local_60;
      sVar8 = toS<int>(&local_48->nshared_objects);
      if (sVar8 <= uVar1) break;
      pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (&this->m);
      peVar4 = std::__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)pMVar3);
      QPDFLogger::getInfo((QPDFLogger *)&local_70,SUB81(peVar4,0));
      peVar5 = std::__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator*((__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         &local_70);
      pPVar6 = Pipeline::operator<<(peVar5,"    identifier ");
      pPVar6 = Pipeline::operator<<(pPVar6,local_60);
      pPVar6 = Pipeline::operator<<(pPVar6,": ");
      pvVar9 = std::vector<int,_std::allocator<int>_>::at(&local_48->shared_identifiers,local_60);
      pPVar6 = Pipeline::operator<<(pPVar6,*pvVar9);
      Pipeline::operator<<(pPVar6,"\n");
      std::shared_ptr<Pipeline>::~shared_ptr(&local_70);
      pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (&this->m);
      peVar4 = std::__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)pMVar3);
      QPDFLogger::getInfo((QPDFLogger *)&local_80,SUB81(peVar4,0));
      peVar5 = std::__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator*((__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         &local_80);
      pPVar6 = Pipeline::operator<<(peVar5,"    numerator ");
      pPVar6 = Pipeline::operator<<(pPVar6,local_60);
      pPVar6 = Pipeline::operator<<(pPVar6,": ");
      pvVar9 = std::vector<int,_std::allocator<int>_>::at(&local_48->shared_numerators,local_60);
      pPVar6 = Pipeline::operator<<(pPVar6,*pvVar9);
      Pipeline::operator<<(pPVar6,"\n");
      std::shared_ptr<Pipeline>::~shared_ptr(&local_80);
      local_60 = local_60 + 1;
    }
    pe = (HPageOffsetEntry *)((long)&pe->delta_nobjects + 1);
  }
  return;
}

Assistant:

void
QPDF::dumpHPageOffset()
{
    HPageOffset& t = m->page_offset_hints;
    *m->log->getInfo() << "min_nobjects: " << t.min_nobjects << "\n"
                       << "first_page_offset: " << adjusted_offset(t.first_page_offset) << "\n"
                       << "nbits_delta_nobjects: " << t.nbits_delta_nobjects << "\n"
                       << "min_page_length: " << t.min_page_length << "\n"
                       << "nbits_delta_page_length: " << t.nbits_delta_page_length << "\n"
                       << "min_content_offset: " << t.min_content_offset << "\n"
                       << "nbits_delta_content_offset: " << t.nbits_delta_content_offset << "\n"
                       << "min_content_length: " << t.min_content_length << "\n"
                       << "nbits_delta_content_length: " << t.nbits_delta_content_length << "\n"
                       << "nbits_nshared_objects: " << t.nbits_nshared_objects << "\n"
                       << "nbits_shared_identifier: " << t.nbits_shared_identifier << "\n"
                       << "nbits_shared_numerator: " << t.nbits_shared_numerator << "\n"
                       << "shared_denominator: " << t.shared_denominator << "\n";

    for (size_t i1 = 0; i1 < toS(m->linp.npages); ++i1) {
        HPageOffsetEntry& pe = t.entries.at(i1);
        *m->log->getInfo() << "Page " << i1 << ":\n"
                           << "  nobjects: " << pe.delta_nobjects + t.min_nobjects << "\n"
                           << "  length: " << pe.delta_page_length + t.min_page_length
                           << "\n"
                           // content offset is relative to page, not file
                           << "  content_offset: " << pe.delta_content_offset + t.min_content_offset
                           << "\n"
                           << "  content_length: " << pe.delta_content_length + t.min_content_length
                           << "\n"
                           << "  nshared_objects: " << pe.nshared_objects << "\n";
        for (size_t i2 = 0; i2 < toS(pe.nshared_objects); ++i2) {
            *m->log->getInfo() << "    identifier " << i2 << ": " << pe.shared_identifiers.at(i2)
                               << "\n";
            *m->log->getInfo() << "    numerator " << i2 << ": " << pe.shared_numerators.at(i2)
                               << "\n";
        }
    }
}